

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

TSMetadataList waitForNextMetadata(SstStream Stream,ssize_t LastTimestep)

{
  _TimestepMetadataMsg *p_Var1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  _TimestepMetadataMsg **pp_Var5;
  __pid_t _Var6;
  pthread_t pVar7;
  char *Format;
  TSMetadataList p_Var8;
  TSMetadataList p_Var9;
  TSMetadataList p_Var10;
  TSMetadataList local_48;
  
  CP_verbose(Stream,PerRankVerbose,"Wait for next metadata after last timestep %ld\n",LastTimestep);
  p_Var9 = (TSMetadataList)0x0;
  do {
    p_Var8 = Stream->Timesteps;
    while (p_Var10 = p_Var9, p_Var8 != (TSMetadataList)0x0) {
      CP_verbose(Stream,TraceVerbose,"Examining metadata for timestep %ld\n",
                 p_Var8->MetadataMsg->Timestep);
      p_Var1 = p_Var8->MetadataMsg;
      if (p_Var1->Metadata == (SstData)0x0) {
        if (p_Var9 == (TSMetadataList)0x0) goto LAB_0073c36e;
LAB_0073c3ac:
        lVar3 = p_Var1->Timestep;
        if ((LastTimestep <= lVar3) &&
           ((p_Var10 = p_Var8, p_Var9 == (TSMetadataList)0x0 && LastTimestep < lVar3 ||
            ((p_Var9 != (TSMetadataList)0x0 && (lVar3 < p_Var9->MetadataMsg->Timestep)))))) break;
        p_Var8 = p_Var8->Next;
      }
      else {
        if ((p_Var9 != (TSMetadataList)0x0) || (Stream->DiscardPriorTimestep <= p_Var1->Timestep))
        goto LAB_0073c3ac;
LAB_0073c36e:
        CP_verbose(Stream,PerRankVerbose,
                   "SstAdvanceStep installing precious metadata for discarded TS %ld\n",
                   p_Var1->Timestep);
        sVar2 = Stream->WriterConfigParams->MarshalMethod;
        if (sVar2 == 2) {
          AddFormatsToMetaMetaInfo(Stream,p_Var8->MetadataMsg);
          AddAttributesToAttrDataList(Stream,p_Var8->MetadataMsg);
        }
        else if (sVar2 == 0) {
          FFSMarshalInstallPreciousMetadata(Stream,p_Var8->MetadataMsg);
        }
        pp_Var5 = &p_Var8->MetadataMsg;
        p_Var8 = p_Var8->Next;
        FreeTimestep(Stream,(*pp_Var5)->Timestep);
      }
    }
    if (p_Var10 == (TSMetadataList)0x0) {
      if ((Stream->Status == Established) &&
         (Stream->FinalTimestep < LastTimestep || Stream->FinalTimestep == 0x7fffffffffffffff)) {
        CP_verbose(Stream,PerRankVerbose,"Waiting for metadata for a Timestep later than TS %ld\n",
                   LastTimestep);
        _Var6 = getpid();
        pVar7 = pthread_self();
        CP_verbose(Stream,TraceVerbose,"(PID %lx, TID %lx) Stream status is %s\n",(long)_Var6,pVar7,
                   SSTStreamStatusStr[Stream->Status]);
        pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,
                          (pthread_mutex_t *)&Stream->DataLock);
        bVar4 = true;
      }
      else {
        CP_verbose(Stream,TraceVerbose,"Stream Final Timestep is %ld, last timestep was %ld\n",
                   Stream->FinalTimestep,LastTimestep);
        if (Stream->Status == PeerFailed) {
          Format = 
          "Wait for next metadata returning NULL because the connection failed before final timestep notification\n"
          ;
LAB_0073c532:
          CP_verbose(Stream,PerRankVerbose,Format);
        }
        else {
          if (Stream->Status == NotOpen) {
            Format = 
            "Wait for next metadata returning NULL because channel was never fully established\n";
            goto LAB_0073c532;
          }
          CP_verbose(Stream,PerStepVerbose,"Wait for next metadata returning NULL, status %d ");
        }
        Stream->CurrentWorkingTimestep = -1;
        local_48 = (TSMetadataList)0x0;
        bVar4 = false;
      }
    }
    else {
      bVar4 = false;
      CP_verbose(Stream,PerRankVerbose,"Returning metadata for timestep %ld\n",
                 p_Var10->MetadataMsg->Timestep);
      Stream->CurrentWorkingTimestep = p_Var10->MetadataMsg->Timestep;
      local_48 = p_Var10;
    }
    p_Var9 = p_Var10;
    if (!bVar4) {
      return local_48;
    }
  } while( true );
}

Assistant:

static TSMetadataList waitForNextMetadata(SstStream Stream, ssize_t LastTimestep)
{
    TSMetadataList FoundTS = NULL;
    CP_verbose(Stream, PerRankVerbose, "Wait for next metadata after last timestep %ld\n",
               LastTimestep);
    while (1)
    {
        struct _TimestepMetadataList *Next;
        Next = Stream->Timesteps;
        while (Next)
        {
            CP_verbose(Stream, TraceVerbose, "Examining metadata for timestep %ld\n",
                       Next->MetadataMsg->Timestep);
            if (((Next->MetadataMsg->Metadata == NULL) ||
                 (Next->MetadataMsg->Timestep < Stream->DiscardPriorTimestep)) &&
                (FoundTS == NULL))
            {
                /*
                 * Either this is a dummy timestep for something that
                 * was discarded on the writer side, or it is a
                 * timestep that satisfies DiscardPriorTimestep and
                 * we've already sent a release for it.  Now is the
                 * time to install the 'precious' info that it carried
                 * (Attributes and formats) and then discard it.
                 */
                CP_verbose(Stream, PerRankVerbose,
                           "SstAdvanceStep installing precious "
                           "metadata for discarded TS %ld\n",
                           Next->MetadataMsg->Timestep);
                if (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS)
                {
                    FFSMarshalInstallPreciousMetadata(Stream, Next->MetadataMsg);
                }
                else if (Stream->WriterConfigParams->MarshalMethod == SstMarshalBP5)
                {
                    AddFormatsToMetaMetaInfo(Stream, Next->MetadataMsg);
                    AddAttributesToAttrDataList(Stream, Next->MetadataMsg);
                }
                TSMetadataList Tmp = Next;
                Next = Next->Next;
                FreeTimestep(Stream, Tmp->MetadataMsg->Timestep);
                continue;
            }
            if (Next->MetadataMsg->Timestep >= LastTimestep)
            {
                if ((FoundTS == NULL) && (Next->MetadataMsg->Timestep > LastTimestep))
                {
                    FoundTS = Next;
                    break;
                }
                else if ((FoundTS != NULL) &&
                         (FoundTS->MetadataMsg->Timestep > Next->MetadataMsg->Timestep))
                {
                    FoundTS = Next;
                    break;
                }
            }
            Next = Next->Next;
        }
        if (FoundTS)
        {
            CP_verbose(Stream, PerRankVerbose, "Returning metadata for timestep %ld\n",
                       FoundTS->MetadataMsg->Timestep);
            Stream->CurrentWorkingTimestep = FoundTS->MetadataMsg->Timestep;
            return FoundTS;
        }
        /* didn't find a good next timestep, check Stream status */
        if ((Stream->Status != Established) ||
            ((Stream->FinalTimestep != SSIZE_T_MAX) && (Stream->FinalTimestep >= LastTimestep)))
        {
            CP_verbose(Stream, TraceVerbose,
                       "Stream Final Timestep is %ld, last timestep was %ld\n",
                       Stream->FinalTimestep, LastTimestep);
            if (Stream->Status == NotOpen)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "channel was never fully established\n");
            }
            else if (Stream->Status == PeerFailed)
            {
                CP_verbose(Stream, PerRankVerbose,
                           "Wait for next metadata returning NULL because "
                           "the connection failed before final timestep "
                           "notification\n");
            }
            else
            {
                CP_verbose(Stream, PerStepVerbose,
                           "Wait for next metadata returning NULL, status %d ", Stream->Status);
            }
            /* closed or failed, return NULL */
            Stream->CurrentWorkingTimestep = -1;
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for metadata for a Timestep later than TS %ld\n", LastTimestep);
        CP_verbose(Stream, TraceVerbose, "(PID %lx, TID %lx) Stream status is %s\n",
                   (unsigned long)getpid(), (unsigned long)gettid(),
                   SSTStreamStatusStr[Stream->Status]);
        /* wait until we get the timestep metadata or something else changes */
        STREAM_CONDITION_WAIT(Stream);
    }
    /* NOTREACHED */
}